

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SSARewriter::ProcessLoad(SSARewriter *this,Instruction *inst,BasicBlock *bb)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t id;
  DefUseManager *this_00;
  TypeManager *this_01;
  Instruction *this_02;
  Type *this_03;
  size_type sVar4;
  mapped_type *pmVar5;
  PhiCandidate *this_04;
  uint32_t var_id;
  uint32_t load_id;
  uint32_t local_48;
  uint32_t local_44;
  Instruction *local_40;
  Type *local_38;
  
  local_48 = 0;
  MemPass::GetPtr(this->pass_,inst,&local_48);
  this_00 = IRContext::get_def_use_mgr((this->pass_->super_Pass).context_);
  this_01 = IRContext::get_type_mgr((this->pass_->super_Pass).context_);
  local_40 = inst;
  uVar3 = Instruction::type_id(inst);
  local_38 = analysis::TypeManager::GetType(this_01,uVar3);
  bVar1 = false;
  uVar3 = 0;
  while( true ) {
    if (bVar1) {
      local_44 = Instruction::result_id(local_40);
      sVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->load_replacement_)._M_h,&local_44);
      if (sVar4 == 0) {
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->load_replacement_,&local_44);
        *pmVar5 = uVar3;
        this_04 = GetPhiCandidate(this,uVar3);
        if (this_04 != (PhiCandidate *)0x0) {
          PhiCandidate::AddUser(this_04,local_44);
        }
        return true;
      }
      __assert_fail("load_replacement_.count(load_id) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                    ,0x192,
                    "bool spvtools::opt::SSARewriter::ProcessLoad(Instruction *, BasicBlock *)");
    }
    bVar1 = MemPass::IsTargetVar(this->pass_,local_48);
    if ((!bVar1) || (uVar3 = GetReachingDef(this,local_48,bb), uVar3 == 0)) break;
    this_02 = analysis::DefUseManager::GetDef(this_00,uVar3);
    bVar1 = true;
    if (this_02 != (Instruction *)0x0) {
      id = Instruction::type_id(this_02);
      this_03 = analysis::TypeManager::GetType(this_01,id);
      bVar2 = analysis::Type::IsSame(this_03,local_38);
      if (!bVar2) {
        bVar1 = false;
        local_48 = uVar3;
      }
    }
  }
  return !bVar1;
}

Assistant:

bool SSARewriter::ProcessLoad(Instruction* inst, BasicBlock* bb) {
  // Get the pointer that we are using to load from.
  uint32_t var_id = 0;
  (void)pass_->GetPtr(inst, &var_id);

  // Get the immediate reaching definition for |var_id|.
  //
  // In the presence of variable pointers, the reaching definition may be
  // another pointer.  For example, the following fragment:
  //
  //  %2 = OpVariable %_ptr_Input_float Input
  // %11 = OpVariable %_ptr_Function__ptr_Input_float Function
  //       OpStore %11 %2
  // %12 = OpLoad %_ptr_Input_float %11
  // %13 = OpLoad %float %12
  //
  // corresponds to the pseudo-code:
  //
  // layout(location = 0) in flat float *%2
  // float %13;
  // float *%12;
  // float **%11;
  // *%11 = %2;
  // %12 = *%11;
  // %13 = *%12;
  //
  // which ultimately, should correspond to:
  //
  // %13 = *%2;
  //
  // During rewriting, the pointer %12 is found to be replaceable by %2 (i.e.,
  // load_replacement_[12] is 2). However, when processing the load
  // %13 = *%12, the type of %12's reaching definition is another float
  // pointer (%2), instead of a float value.
  //
  // When this happens, we need to continue looking up the reaching definition
  // chain until we get to a float value or a non-target var (i.e. a variable
  // that cannot be SSA replaced, like %2 in this case since it is a function
  // argument).
  analysis::DefUseManager* def_use_mgr = pass_->context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = pass_->context()->get_type_mgr();
  analysis::Type* load_type = type_mgr->GetType(inst->type_id());
  uint32_t val_id = 0;
  bool found_reaching_def = false;
  while (!found_reaching_def) {
    if (!pass_->IsTargetVar(var_id)) {
      // If the variable we are loading from is not an SSA target (globals,
      // function parameters), do nothing.
      return true;
    }

    val_id = GetReachingDef(var_id, bb);
    if (val_id == 0) {
      return false;
    }

    // If the reaching definition is a pointer type different than the type of
    // the instruction we are analyzing, then it must be a reference to another
    // pointer (otherwise, this would be invalid SPIRV).  We continue
    // de-referencing it by making |val_id| be |var_id|.
    //
    // NOTE: if there is no reaching definition instruction, it means |val_id|
    // is an undef.
    Instruction* reaching_def_inst = def_use_mgr->GetDef(val_id);
    if (reaching_def_inst &&
        !type_mgr->GetType(reaching_def_inst->type_id())->IsSame(load_type)) {
      var_id = val_id;
    } else {
      found_reaching_def = true;
    }
  }

  // Schedule a replacement for the result of this load instruction with
  // |val_id|. After all the rewriting decisions are made, every use of
  // this load will be replaced with |val_id|.
  uint32_t load_id = inst->result_id();
  assert(load_replacement_.count(load_id) == 0);
  load_replacement_[load_id] = val_id;
  PhiCandidate* defining_phi = GetPhiCandidate(val_id);
  if (defining_phi) {
    defining_phi->AddUser(load_id);
  }

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "\tFound load: "
            << inst->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << " (replacement for %" << load_id << " is %" << val_id << ")\n";
#endif

  return true;
}